

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

SignedCastExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SignedCastExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ParenthesizedExpressionSyntax *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SignedCastExpressionSyntax *pSVar11;
  
  pSVar11 = (SignedCastExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SignedCastExpressionSyntax *)this->endPtr < pSVar11 + 1) {
    pSVar11 = (SignedCastExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pSVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pSVar11->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pSVar11->super_ExpressionSyntax).super_SyntaxNode.kind = SignedCastExpression;
  (pSVar11->signing).kind = TVar3;
  (pSVar11->signing).field_0x2 = uVar4;
  (pSVar11->signing).numFlags = (NumericTokenFlags)NVar5.raw;
  (pSVar11->signing).rawLen = uVar6;
  (pSVar11->signing).info = pIVar1;
  (pSVar11->apostrophe).kind = TVar7;
  (pSVar11->apostrophe).field_0x2 = uVar8;
  (pSVar11->apostrophe).numFlags = (NumericTokenFlags)NVar9.raw;
  (pSVar11->apostrophe).rawLen = uVar10;
  (pSVar11->apostrophe).info = pIVar2;
  (pSVar11->inner).ptr = args_2;
  (args_2->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)pSVar11;
  return pSVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }